

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_TEXLD(Context *ctx)

{
  int iVar1;
  int sampler;
  DestArgInfo *info;
  SourceArgInfo *src1;
  SourceArgInfo *src0;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar1 == 0) {
    iVar1 = shader_version_atleast(ctx,'\x01','\x04');
    if (iVar1 == 0) {
      iVar1 = (ctx->dest_arg).regnum;
      if ((ctx->dest_arg).regtype != REG_TYPE_ADDRESS) {
        fail(ctx,"TEX param must be a texture register");
      }
      add_sampler(ctx,iVar1,TEXTURE_TYPE_2D,0);
      add_attribute_register(ctx,REG_TYPE_ADDRESS,iVar1,MOJOSHADER_USAGE_TEXCOORD,iVar1,0xf,0);
    }
  }
  else {
    if (ctx->source_args[0].src_mod == SRCMOD_NONE) {
      if (ctx->source_args[1].regtype == REG_TYPE_SAMPLER) {
        if (ctx->source_args[1].src_mod == SRCMOD_NONE) {
          if (((ctx->instruction_controls != 0) && (ctx->instruction_controls != 1)) &&
             (ctx->instruction_controls != 2)) {
            fail(ctx,"TEXLD has unknown control bits");
          }
        }
        else {
          fail(ctx,"TEXLD src1 must have no modifiers");
        }
      }
      else {
        fail(ctx,"TEXLD src1 must be sampler register");
      }
    }
    else {
      fail(ctx,"TEXLD src0 must have no modifiers");
    }
    iVar1 = shader_version_atleast(ctx,'\x03','\0');
    if (iVar1 == 0) {
      iVar1 = no_swizzle(ctx->source_args[0].swizzle);
      if (iVar1 == 0) {
        fail(ctx,"TEXLD src0 must not swizzle");
      }
      else {
        iVar1 = no_swizzle(ctx->source_args[1].swizzle);
        if (iVar1 == 0) {
          fail(ctx,"TEXLD src1 must not swizzle");
        }
      }
    }
    if (ctx->source_args[1].regnum == 3) {
      ctx->instruction_count = ctx->instruction_count + 3;
    }
  }
  return;
}

Assistant:

static void state_TEXLD(Context *ctx)
{
    if (shader_version_atleast(ctx, 2, 0))
    {
        const SourceArgInfo *src0 = &ctx->source_args[0];
        const SourceArgInfo *src1 = &ctx->source_args[1];

        // !!! FIXME: verify texldp restrictions:
        //http://msdn.microsoft.com/en-us/library/bb206221(VS.85).aspx
        // !!! FIXME: ...and texldb, too.
        //http://msdn.microsoft.com/en-us/library/bb206217(VS.85).aspx

        //const RegisterType rt0 = src0->regtype;

        // !!! FIXME: msdn says it has to be temp, but Microsoft's HLSL
        // !!! FIXME:  compiler is generating code that uses oC0 for a dest.
        //if (ctx->dest_arg.regtype != REG_TYPE_TEMP)
        //    fail(ctx, "TEXLD dest must be a temp register");

        // !!! FIXME: this can be an REG_TYPE_INPUT, DCL'd to TEXCOORD.
        //else if ((rt0 != REG_TYPE_TEXTURE) && (rt0 != REG_TYPE_TEMP))
        //    fail(ctx, "TEXLD src0 must be texture or temp register");
        //else

        if (src0->src_mod != SRCMOD_NONE)
            fail(ctx, "TEXLD src0 must have no modifiers");
        else if (src1->regtype != REG_TYPE_SAMPLER)
            fail(ctx, "TEXLD src1 must be sampler register");
        else if (src1->src_mod != SRCMOD_NONE)
            fail(ctx, "TEXLD src1 must have no modifiers");
        else if ( (ctx->instruction_controls != CONTROL_TEXLD) &&
                  (ctx->instruction_controls != CONTROL_TEXLDP) &&
                  (ctx->instruction_controls != CONTROL_TEXLDB) )
        {
            fail(ctx, "TEXLD has unknown control bits");
        } // else if

        // Shader Model 3 added swizzle support to this opcode.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (!no_swizzle(src0->swizzle))
                fail(ctx, "TEXLD src0 must not swizzle");
            else if (!no_swizzle(src1->swizzle))
                fail(ctx, "TEXLD src1 must not swizzle");
        } // if

        if ( ((TextureType) ctx->source_args[1].regnum) == TEXTURE_TYPE_CUBE )
            ctx->instruction_count += 3;
    } // if

    else if (shader_version_atleast(ctx, 1, 4))
    {
        // !!! FIXME: checks for ps_1_4 version here...
    } // else if

    else
    {
        // !!! FIXME: add (other?) checks for ps_1_1 version here...
        const DestArgInfo *info = &ctx->dest_arg;
        const int sampler = info->regnum;
        if (info->regtype != REG_TYPE_TEXTURE)
            fail(ctx, "TEX param must be a texture register");
        add_sampler(ctx, sampler, TEXTURE_TYPE_2D, 0);
        add_attribute_register(ctx, REG_TYPE_TEXTURE, sampler,
                               MOJOSHADER_USAGE_TEXCOORD, sampler, 0xF, 0);
    } // else
}